

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::memberAccess(Parser *this,ptr<Expression> *callee)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<Expression> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ptr<Expression> pVar2;
  undefined1 local_59;
  MemberAccess *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  MemberAccess *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  consume((Parser *)callee);
  variable((Parser *)&stack0xffffffffffffffd0);
  local_58 = (MemberAccess *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MemberAccess,std::allocator<MemberAccess>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
            (a_Stack_50,&local_58,(allocator<MemberAccess> *)&local_59,in_RDX,
             (shared_ptr<Expression> *)&stack0xffffffffffffffd0);
  this_00._M_pi = a_Stack_50[0]._M_pi;
  local_40 = local_58;
  local_58 = (MemberAccess *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  local_38 = this_00._M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
  }
  pVar2 = postfix(this,callee);
  _Var1 = pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var1._M_pi = extraout_RDX;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::memberAccess(ptr<Expression> callee) {
    consume();
    ptr<Expression> expr = make<MemberAccess>(callee, variable());
    return postfix(expr);
}